

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<TPZManVector<double,_3>,_4>::Resize
          (TPZManVector<TPZManVector<double,_3>,_4> *this,int64_t newsize,
          TPZManVector<double,_3> *object)

{
  double dVar1;
  undefined1 auVar2 [16];
  TPZManVector<double,_3> *pTVar3;
  ostream *this_00;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  TPZManVector<double,_3> *pTVar7;
  long in_RSI;
  TPZManVector<TPZManVector<double,_3>,_4> *in_RDI;
  ulong uVar8;
  TPZManVector<double,_3> *newstore;
  int64_t realsize;
  int64_t i_2;
  int64_t i_1;
  int64_t i;
  TPZManVector<double,_3> *in_stack_ffffffffffffff10;
  TPZManVector<double,_3> *this_01;
  TPZManVector<double,_3> *in_stack_ffffffffffffff28;
  TPZManVector<double,_3> *in_stack_ffffffffffffff30;
  TPZManVector<double,_3> *pTVar9;
  TPZManVector<double,_3> *local_a8;
  long local_30;
  long local_28;
  long local_20;
  
  if (in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != (in_RDI->super_TPZVec<TPZManVector<double,_3>_>).fNElements) {
    if ((in_RDI->super_TPZVec<TPZManVector<double,_3>_>).fNAlloc < in_RSI) {
      if (in_RSI < 5) {
        for (local_28 = 0; local_28 < (in_RDI->super_TPZVec<TPZManVector<double,_3>_>).fNElements;
            local_28 = local_28 + 1) {
          TPZManVector<double,_3>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        }
        for (; local_28 < in_RSI; local_28 = local_28 + 1) {
          TPZManVector<double,_3>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        }
        if (((in_RDI->super_TPZVec<TPZManVector<double,_3>_>).fStore !=
             (TPZManVector<double,_3> *)&in_RDI->field_0x20) &&
           (pTVar7 = (in_RDI->super_TPZVec<TPZManVector<double,_3>_>).fStore,
           pTVar7 != (TPZManVector<double,_3> *)0x0)) {
          dVar1 = pTVar7[-1].fExtAlloc[2];
          for (pTVar9 = pTVar7 + (long)dVar1; pTVar7 != pTVar9; pTVar9 = pTVar9 + -1) {
            TPZManVector<double,_3>::~TPZManVector(in_stack_ffffffffffffff10);
          }
          operator_delete__(pTVar7[-1].fExtAlloc + 2,(long)dVar1 * 0x38 + 8);
        }
        (in_RDI->super_TPZVec<TPZManVector<double,_3>_>).fStore =
             (TPZManVector<double,_3> *)&in_RDI->field_0x20;
        (in_RDI->super_TPZVec<TPZManVector<double,_3>_>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<TPZManVector<double,_3>_>).fNAlloc = 4;
      }
      else {
        uVar4 = ExpandSize(in_RDI,in_RSI);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar4;
        uVar5 = SUB168(auVar2 * ZEXT816(0x38),0);
        uVar8 = uVar5 + 8;
        if (SUB168(auVar2 * ZEXT816(0x38),8) != 0 || 0xfffffffffffffff7 < uVar5) {
          uVar8 = 0xffffffffffffffff;
        }
        puVar6 = (ulong *)operator_new__(uVar8);
        *puVar6 = uVar4;
        pTVar7 = (TPZManVector<double,_3> *)(puVar6 + 1);
        if (uVar4 != 0) {
          local_a8 = pTVar7;
          do {
            TPZManVector<double,_3>::TPZManVector
                      (in_stack_ffffffffffffff30,(int64_t)in_stack_ffffffffffffff28);
            local_a8 = local_a8 + 1;
          } while (local_a8 != pTVar7 + uVar4);
        }
        for (local_30 = 0; local_30 < (in_RDI->super_TPZVec<TPZManVector<double,_3>_>).fNElements;
            local_30 = local_30 + 1) {
          TPZManVector<double,_3>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        }
        for (; local_30 < in_RSI; local_30 = local_30 + 1) {
          TPZManVector<double,_3>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        }
        if (((in_RDI->super_TPZVec<TPZManVector<double,_3>_>).fStore !=
             (TPZManVector<double,_3> *)&in_RDI->field_0x20) &&
           (pTVar9 = (in_RDI->super_TPZVec<TPZManVector<double,_3>_>).fStore,
           pTVar9 != (TPZManVector<double,_3> *)0x0)) {
          pTVar3 = pTVar9 + -1;
          dVar1 = pTVar9[-1].fExtAlloc[2];
          this_01 = pTVar9 + (long)dVar1;
          if (pTVar9 != this_01) {
            do {
              this_01 = this_01 + -1;
              TPZManVector<double,_3>::~TPZManVector(this_01);
            } while (this_01 != pTVar9);
          }
          operator_delete__(pTVar3->fExtAlloc + 2,(long)dVar1 * 0x38 + 8);
        }
        (in_RDI->super_TPZVec<TPZManVector<double,_3>_>).fStore = pTVar7;
        (in_RDI->super_TPZVec<TPZManVector<double,_3>_>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<TPZManVector<double,_3>_>).fNAlloc = uVar4;
      }
    }
    else {
      for (local_20 = (in_RDI->super_TPZVec<TPZManVector<double,_3>_>).fNElements; local_20 < in_RSI
          ; local_20 = local_20 + 1) {
        TPZManVector<double,_3>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      }
      (in_RDI->super_TPZVec<TPZManVector<double,_3>_>).fNElements = in_RSI;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}